

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicStruct> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnp::DynamicStruct>
          (Orphan<capnp::DynamicStruct> *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  StructSchema schema;
  OrphanBuilder *builder;
  Fault local_20;
  Fault f;
  Orphan<capnp::DynamicValue> *this_local;
  
  f.exception = (Exception *)this;
  if (this->type == STRUCT) {
    this->type = UNKNOWN;
    schema.super_Schema.raw = (Schema)(this->field_1).structSchema.super_Schema.raw;
    builder = kj::mv<capnp::_::OrphanBuilder>(&this->builder);
    capnp::Orphan<capnp::DynamicStruct>::Orphan(__return_storage_ptr__,schema,builder);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x852,FAILED,"type == DynamicValue::STRUCT","\"Value type mismatch.\"",
             (char (*) [21])"Value type mismatch.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

Orphan<DynamicStruct> Orphan<DynamicValue>::releaseAs<DynamicStruct>() {
  KJ_REQUIRE(type == DynamicValue::STRUCT, "Value type mismatch.");
  type = DynamicValue::UNKNOWN;
  return Orphan<DynamicStruct>(structSchema, kj::mv(builder));
}